

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_export.c
# Opt level: O0

REF_STATUS ref_export_tec(REF_GRID ref_grid,char *filename)

{
  FILE *__stream;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  FILE *file;
  char *filename_local;
  REF_GRID ref_grid_local;
  
  __stream = fopen(filename,"w");
  if (__stream == (FILE *)0x0) {
    printf("unable to open %s\n",filename);
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",0x2fa,
           "ref_export_tec","unable to open file");
    ref_grid_local._4_4_ = 2;
  }
  else {
    fprintf(__stream,"title=\"tecplot refine geometry file\"\n");
    fprintf(__stream,"variables = \"x\" \"y\" \"z\"\n");
    ref_grid_local._4_4_ = ref_export_tec_vol_zone(ref_grid,(FILE *)__stream);
    if (ref_grid_local._4_4_ == 0) {
      ref_grid_local._4_4_ = ref_export_tec_surf_zone(ref_grid,(FILE *)__stream);
      if (ref_grid_local._4_4_ == 0) {
        ref_grid_local._4_4_ = ref_export_tec_tr2_zone(ref_grid,(FILE *)__stream);
        if (ref_grid_local._4_4_ == 0) {
          ref_grid_local._4_4_ = ref_export_tec_tr3_zone(ref_grid,(FILE *)__stream);
          if (ref_grid_local._4_4_ == 0) {
            ref_grid_local._4_4_ = ref_export_tec_edg_zone(ref_grid,(FILE *)__stream);
            if (ref_grid_local._4_4_ == 0) {
              ref_grid_local._4_4_ = ref_export_tec_ed2_zone(ref_grid,(FILE *)__stream);
              if (ref_grid_local._4_4_ == 0) {
                ref_grid_local._4_4_ = ref_export_tec_ed3_zone(ref_grid,(FILE *)__stream);
                if (ref_grid_local._4_4_ == 0) {
                  fclose(__stream);
                  ref_grid_local._4_4_ = 0;
                }
                else {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                         ,0x305,"ref_export_tec",(ulong)ref_grid_local._4_4_,"ed3");
                }
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                       ,0x304,"ref_export_tec",(ulong)ref_grid_local._4_4_,"ed2");
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                     ,0x303,"ref_export_tec",(ulong)ref_grid_local._4_4_,"edg");
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                   ,0x302,"ref_export_tec",(ulong)ref_grid_local._4_4_,"tr3");
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
                 0x301,"ref_export_tec",(ulong)ref_grid_local._4_4_,"tr2");
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
               0x300,"ref_export_tec",(ulong)ref_grid_local._4_4_,"surf");
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
             0x2ff,"ref_export_tec",(ulong)ref_grid_local._4_4_,"vol");
    }
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_export_tec(REF_GRID ref_grid,
                                         const char *filename) {
  FILE *file;

  file = fopen(filename, "w");
  if (NULL == (void *)file) printf("unable to open %s\n", filename);
  RNS(file, "unable to open file");

  fprintf(file, "title=\"tecplot refine geometry file\"\n");
  fprintf(file, "variables = \"x\" \"y\" \"z\"\n");

  RSS(ref_export_tec_vol_zone(ref_grid, file), "vol");
  RSS(ref_export_tec_surf_zone(ref_grid, file), "surf");
  RSS(ref_export_tec_tr2_zone(ref_grid, file), "tr2");
  RSS(ref_export_tec_tr3_zone(ref_grid, file), "tr3");
  RSS(ref_export_tec_edg_zone(ref_grid, file), "edg");
  RSS(ref_export_tec_ed2_zone(ref_grid, file), "ed2");
  RSS(ref_export_tec_ed3_zone(ref_grid, file), "ed3");

  fclose(file);
  return REF_SUCCESS;
}